

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

bool __thiscall Highs::infeasibleBoundsOk(Highs *this)

{
  double *pdVar1;
  double dVar2;
  pointer pHVar3;
  pointer pHVar4;
  HighsLogOptions *log_options_;
  long lVar5;
  HighsInt iRow;
  long lVar6;
  allocator local_a1;
  HighsInt num_true_infeasible_bound;
  HighsInt num_ok_infeasible_bound;
  HighsLogOptions *local_98;
  anon_class_32_4_0faf6aa2 assessInfeasibleBound;
  string local_70;
  string local_50;
  
  local_98 = &(this->options_).super_HighsOptionsStruct.log_options;
  assessInfeasibleBound.num_true_infeasible_bound = &num_true_infeasible_bound;
  num_true_infeasible_bound = 0;
  assessInfeasibleBound.num_ok_infeasible_bound = &num_ok_infeasible_bound;
  num_ok_infeasible_bound = 0;
  pHVar3 = (this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar4 = (this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = 0;
  assessInfeasibleBound.this = this;
  assessInfeasibleBound.log_options = local_98;
  for (lVar5 = 0; lVar5 < (this->model_).lp_.num_col_; lVar5 = lVar5 + 1) {
    if (((pHVar4 == pHVar3) ||
        (((this->model_).lp_.integrality_.
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] & ~kInteger) != kSemiContinuous)) &&
       (dVar2 = *(double *)
                 ((long)(this->model_).lp_.col_lower_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar6),
       pdVar1 = (double *)
                ((long)(this->model_).lp_.col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar6),
       *pdVar1 <= dVar2 && dVar2 != *pdVar1)) {
      std::__cxx11::string::string((string *)&local_50,"Column",&local_a1);
      infeasibleBoundsOk::anon_class_32_4_0faf6aa2::operator()
                (&assessInfeasibleBound,&local_50,(HighsInt)lVar5,
                 (double *)
                 ((long)(this->model_).lp_.col_lower_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar6),
                 (double *)
                 ((long)(this->model_).lp_.col_upper_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar6));
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar6 = lVar6 + 8;
  }
  lVar5 = 0;
  for (lVar6 = 0; log_options_ = local_98, lVar6 < (this->model_).lp_.num_row_; lVar6 = lVar6 + 1) {
    dVar2 = *(double *)
             ((long)(this->model_).lp_.row_lower_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar5);
    pdVar1 = (double *)
             ((long)(this->model_).lp_.row_upper_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar5);
    if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
      std::__cxx11::string::string((string *)&local_70,"Row",&local_a1);
      infeasibleBoundsOk::anon_class_32_4_0faf6aa2::operator()
                (&assessInfeasibleBound,&local_70,(HighsInt)lVar6,
                 (double *)
                 ((long)(this->model_).lp_.row_lower_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar5),
                 (double *)
                 ((long)(this->model_).lp_.row_upper_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar5));
      std::__cxx11::string::~string((string *)&local_70);
    }
    lVar5 = lVar5 + 8;
  }
  if (0 < num_ok_infeasible_bound) {
    highsLogUser(local_98,kInfo,"Model has %d small inconsistent bound(s): rectified\n");
  }
  if (0 < num_true_infeasible_bound) {
    highsLogUser(log_options_,kInfo,"Model has %d significant inconsistent bound(s): infeasible\n");
  }
  return num_true_infeasible_bound == 0;
}

Assistant:

bool Highs::infeasibleBoundsOk() {
  const HighsLogOptions& log_options = this->options_.log_options;
  HighsLp& lp = this->model_.lp_;

  HighsInt num_true_infeasible_bound = 0;
  HighsInt num_ok_infeasible_bound = 0;
  const bool has_integrality = lp.integrality_.size() > 0;
  // Lambda for assessing infeasible bounds
  auto assessInfeasibleBound = [&](const std::string type, const HighsInt iX,
                                   double& lower, double& upper) {
    double range = upper - lower;
    if (range >= 0) return true;
    if (range > -this->options_.primal_feasibility_tolerance) {
      num_ok_infeasible_bound++;
      bool report = num_ok_infeasible_bound <= 10;
      bool integer_lower = lower == std::floor(lower + 0.5);
      bool integer_upper = upper == std::floor(upper + 0.5);
      assert(!integer_lower || !integer_upper);
      if (integer_lower) {
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "upper bound to %g\n",
                       type.c_str(), int(iX), lower, upper, range, lower);
        upper = lower;
      } else if (integer_upper) {
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "lower bound to %g\n",
                       type.c_str(), int(iX), lower, upper, range, upper);
        lower = upper;
      } else {
        double mid = 0.5 * (lower + upper);
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "both bounds to %g\n",
                       type.c_str(), int(iX), lower, upper, range, mid);
        lower = mid;
        upper = mid;
      }
      return true;
    }
    num_true_infeasible_bound++;
    if (num_true_infeasible_bound <= 10)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "%s %d bounds [%g, %g] have excessive infeasibility = %g\n",
                   type.c_str(), int(iX), lower, upper, range);
    return false;
  };

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (has_integrality) {
      // Semi-variables can have inconsistent bounds
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
          lp.integrality_[iCol] == HighsVarType::kSemiInteger)
        continue;
    }
    if (lp.col_lower_[iCol] > lp.col_upper_[iCol])
      assessInfeasibleBound("Column", iCol, lp.col_lower_[iCol],
                            lp.col_upper_[iCol]);
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lp.row_lower_[iRow] > lp.row_upper_[iRow])
      assessInfeasibleBound("Row", iRow, lp.row_lower_[iRow],
                            lp.row_upper_[iRow]);
  }
  if (num_ok_infeasible_bound > 0)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Model has %d small inconsistent bound(s): rectified\n",
                 int(num_ok_infeasible_bound));
  if (num_true_infeasible_bound > 0)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Model has %d significant inconsistent bound(s): infeasible\n",
                 int(num_true_infeasible_bound));
  return num_true_infeasible_bound == 0;
}